

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_fopen(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_vm *pVm;
  char *zFile;
  char *pStream_00;
  int iVar1;
  void *pvVar2;
  int local_7c;
  int local_58;
  int iOpenFlags;
  int imLen;
  int iLen;
  io_private *pDev;
  jx9_value *pResource;
  char *zMode;
  char *zUri;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pStream = (jx9_io_stream *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pjStack_18,2,"Expecting a file path or URL");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    zMode = jx9_value_to_string((jx9_value *)pStream->zName,&iOpenFlags);
    if (apArg_local._4_4_ < 2) {
      pResource = (jx9_value *)0x16a42f;
      local_58 = 1;
    }
    else {
      pResource = (jx9_value *)jx9_value_to_string(*(jx9_value **)&pStream->iVersion,&local_58);
    }
    zUri = (char *)jx9VmGetStreamDevice(pjStack_18->pVm,&zMode,iOpenFlags);
    if ((jx9_io_stream *)zUri == (jx9_io_stream *)0x0) {
      jx9_context_throw_error_format
                (pjStack_18,2,"No stream device is associated with the given URI(%s)",zMode);
      jx9_result_bool(pjStack_18,0);
    }
    else {
      _imLen = (io_private *)jx9_context_alloc_chunk(pjStack_18,0x38,1,0);
      if (_imLen == (io_private *)0x0) {
        jx9_context_throw_error(pjStack_18,1,"JX9 is running out of memory");
        jx9_result_bool(pjStack_18,0);
      }
      else {
        pDev = (io_private *)0x0;
        if (apArg_local._4_4_ < 4) {
          iVar1 = is_jx9_stream((jx9_io_stream *)zUri);
          if (iVar1 != 0) {
            pDev = (io_private *)pStream->zName;
          }
        }
        else {
          pDev = (io_private *)pStream->xOpenDir;
        }
        InitIOPrivate(pjStack_18->pVm,(jx9_io_stream *)zUri,_imLen);
        iVar1 = StrModeToFlags(pjStack_18,(char *)pResource,local_58);
        pStream_00 = zUri;
        zFile = zMode;
        pVm = pjStack_18->pVm;
        if (apArg_local._4_4_ < 3) {
          local_7c = 0;
        }
        else {
          local_7c = jx9_value_to_bool((jx9_value *)pStream->xOpen);
        }
        pvVar2 = jx9StreamOpenHandle(pVm,(jx9_io_stream *)pStream_00,zFile,iVar1,local_7c,
                                     (jx9_value *)pDev,0,(int *)0x0);
        _imLen->pHandle = pvVar2;
        if (_imLen->pHandle == (void *)0x0) {
          jx9_context_throw_error_format(pjStack_18,1,"IO error while opening \'%s\'",zMode);
          jx9_result_bool(pjStack_18,0);
          jx9_context_free_chunk(pjStack_18,_imLen);
        }
        else {
          jx9_result_resource(pjStack_18,_imLen);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_fopen(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zUri, *zMode;
	jx9_value *pResource;
	io_private *pDev;
	int iLen, imLen;
	int iOpenFlags;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path or URL");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the URI and the desired access mode */
	zUri  = jx9_value_to_string(apArg[0], &iLen);
	if( nArg > 1 ){
		zMode = jx9_value_to_string(apArg[1], &imLen);
	}else{
		/* Set a default read-only mode */
		zMode = "r";
		imLen = (int)sizeof(char);
	}
	/* Try to extract a stream */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zUri, iLen);
	if( pStream == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"No stream device is associated with the given URI(%s)", zUri);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Allocate a new IO private instance */
	pDev = (io_private *)jx9_context_alloc_chunk(pCtx, sizeof(io_private), TRUE, FALSE);
	if( pDev == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pResource = 0;
	if( nArg > 3 ){
		pResource = apArg[3];
	}else if( is_jx9_stream(pStream) ){
		/* TICKET 1433-80: The jx9:// stream need a jx9_value to access the underlying
		 * virtual machine.
		 */
		pResource = apArg[0];
	}
	/* Initialize the structure */
	InitIOPrivate(pCtx->pVm, pStream, pDev);
	/* Convert open mode to JX9 flags */
	iOpenFlags = StrModeToFlags(pCtx, zMode, imLen);
	/* Try to get a handle */
	pDev->pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zUri, iOpenFlags, 
		nArg > 2 ? jx9_value_to_bool(apArg[2]) : FALSE, pResource, FALSE, 0);
	if( pDev->pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zUri);
		jx9_result_bool(pCtx, 0);
		jx9_context_free_chunk(pCtx, pDev);
		return JX9_OK;
	}
	/* All done, return the io_private instance as a resource */
	jx9_result_resource(pCtx, pDev);
	return JX9_OK;
}